

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
::~raw_hash_set(raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
                *this)

{
  Layout LVar1;
  
  if (this->capacity_ != 0) {
    LVar1 = MakeLayout(this->capacity_);
    Deallocate<4ul,std::allocator<int>>
              ((allocator<int> *)&this->settings_,this->ctrl_,
               (LVar1.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
                .size_[0] + 3 & 0xfffffffffffffffc) +
               LVar1.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
               .size_[1] * 4);
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    this->ctrl_ = (ctrl_t *)0x0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

~raw_hash_set() { destroy_slots(); }